

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::
     unserialize_helper<serialization::json_iarchive,std::vector<int,std::allocator<int>>>
               (json_iarchive *ar,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *v)

{
  size_type sVar1;
  size_type i;
  vector<int,_std::allocator<int>_> tmp;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  sVar1 = json_iarchive::load_sequence_start(ar);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::reserve(v,(ulong)sVar1);
  for (i = 0; sVar1 != i; i = i + 1) {
    json_iarchive::load_sequence_item_start(ar,i);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unserialize_helper<serialization::json_iarchive,int>
              (ar,(vector<int,_std::allocator<int>_> *)&local_48);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)v,(vector<int,_std::allocator<int>_> *)&local_48);
    json_iarchive::load_sequence_item_end(ar);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::vector<T> & v)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto size = ar.load_sequence_start();
    v.reserve(size);
    for(size_type i = 0; i < size; ++i)
    {
        ar.load_sequence_item_start(i);
        T tmp;
        unserialize_helper(ar, tmp);
        v.push_back(std::move(tmp));
        ar.load_sequence_item_end();
    }

    ar.load_sequence_end();
}